

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLcode formdata_add_filename(curl_httppost *file,FormData **form,curl_off_t *size)

{
  curl_malloc_callback p_Var1;
  curl_strdup_callback p_Var2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  
  if (file->showfilename == (char *)0x0) {
    pcVar9 = (*Curl_cstrdup)(file->contents);
    p_Var2 = Curl_cstrdup;
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar7 = __xpg_basename(pcVar9);
    pcVar7 = (*p_Var2)(pcVar7);
    (*Curl_cfree)(pcVar9);
    pcVar9 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar7 = (char *)0x0;
    pcVar9 = file->showfilename;
  }
  pcVar4 = strchr(pcVar9,0x5c);
  if ((pcVar4 == (char *)0x0) && (pcVar4 = strchr(pcVar9,0x22), pcVar4 == (char *)0x0)) {
    CVar3 = AddFormDataf(form,size,"; filename=\"%s\"",pcVar9);
  }
  else {
    p_Var1 = Curl_cmalloc;
    sVar5 = strlen(pcVar9);
    pcVar6 = (char *)(*p_Var1)(sVar5 * 2 + 1);
    pcVar4 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      do {
        cVar8 = *pcVar9;
        if ((cVar8 == '\"') || (cVar8 == '\\')) {
          *pcVar4 = '\\';
          pcVar4 = pcVar4 + 1;
          cVar8 = *pcVar9;
        }
        else if (cVar8 == '\0') goto LAB_0057315b;
        pcVar9 = pcVar9 + 1;
        *pcVar4 = cVar8;
        pcVar4 = pcVar4 + 1;
      } while( true );
    }
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
LAB_005731f0:
  if (pcVar7 != (char *)0x0) {
    (*Curl_cfree)(pcVar7);
  }
  return CVar3;
LAB_0057315b:
  *pcVar4 = '\0';
  CVar3 = AddFormDataf(form,size,"; filename=\"%s\"",pcVar6);
  (*Curl_cfree)(pcVar6);
  goto LAB_005731f0;
}

Assistant:

static CURLcode formdata_add_filename(const struct curl_httppost *file,
                                      struct FormData **form,
                                      curl_off_t *size)
{
  CURLcode result = CURLE_OK;
  char *filename = file->showfilename;
  char *filebasename = NULL;
  char *filename_escaped = NULL;

  if(!filename) {
    filebasename = strippath(file->contents);
    if(!filebasename)
      return CURLE_OUT_OF_MEMORY;
    filename = filebasename;
  }

  if(strchr(filename, '\\') || strchr(filename, '"')) {
    char *p0, *p1;

    /* filename need be escaped */
    filename_escaped = malloc(strlen(filename)*2+1);
    if(!filename_escaped) {
      Curl_safefree(filebasename);
      return CURLE_OUT_OF_MEMORY;
    }
    p0 = filename_escaped;
    p1 = filename;
    while(*p1) {
      if(*p1 == '\\' || *p1 == '"')
        *p0++ = '\\';
      *p0++ = *p1++;
    }
    *p0 = '\0';
    filename = filename_escaped;
  }
  result = AddFormDataf(form, size,
                        "; filename=\"%s\"",
                        filename);
  Curl_safefree(filename_escaped);
  Curl_safefree(filebasename);
  return result;
}